

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraEclipseCDT4Generator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraEclipseCDT4Generator> *this)

{
  cmExtraEclipseCDT4Generator *this_00;
  string local_48;
  cmExtraEclipseCDT4Generator *local_18;
  cmExtraEclipseCDT4Generator *p;
  cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraEclipseCDT4Generator> *this_local;
  
  p = (cmExtraEclipseCDT4Generator *)this;
  this_00 = (cmExtraEclipseCDT4Generator *)operator_new(0xd8);
  cmExtraEclipseCDT4Generator::cmExtraEclipseCDT4Generator(this_00);
  local_18 = this_00;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&local_48,&this->super_cmExternalMakefileProjectGeneratorFactory);
  cmExternalMakefileProjectGenerator::SetName
            ((cmExternalMakefileProjectGenerator *)this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return &local_18->super_cmExternalMakefileProjectGenerator;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const override
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }